

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_kvtree_bcast.c
# Opt level: O2

int empty_broadcast_test(kvtree *kvtree_1,int rank)

{
  int iVar1;
  
  if (rank == 0) {
    kvtree_1 = (kvtree *)kvtree_new();
  }
  iVar1 = kvtree_bcast(kvtree_1,0,&ompi_mpi_comm_world);
  if (iVar1 == 0) {
    iVar1 = kvtree_size(kvtree_1);
    if (iVar1 == 0) {
      return 0;
    }
    printf("Error in line %d, file %s, function %s.\n",0x66,
           "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_bcast.c"
           ,"empty_broadcast_test");
    printf("rank =%d, broadcast of empty tree resulted in non-empty tree on receprtion\n",rank);
  }
  else {
    printf("Error in line %d, file %s, function %s.\n",0x60,
           "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_bcast.c"
           ,"empty_broadcast_test");
    printf("kvtree_bcast empty operation failed");
  }
  return 1;
}

Assistant:

int empty_broadcast_test(kvtree *kvtree_1, int rank){
  int kvtree_rc = TEST_PASS;
  //re-initialize kvtree to empty n rank 0 and broadcast
  if(rank==0) kvtree_1 = kvtree_new();
  kvtree_rc = kvtree_bcast(kvtree_1, 0, MPI_COMM_WORLD);
  if (kvtree_rc != KVTREE_SUCCESS){
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
    printf("kvtree_bcast empty operation failed");
    return TEST_FAIL;
  }
  if(kvtree_size(kvtree_1) != 0)
  {
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
    printf("rank =%d, broadcast of empty tree resulted in non-empty tree on receprtion\n", rank);
    return TEST_FAIL;
  }

  return TEST_PASS;
}